

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeSingleSuccessorInfo::PathTypeSingleSuccessorInfo
          (PathTypeSingleSuccessorInfo *this,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->successorKey).propertyId = key.propertyId;
  (this->successorKey).attributes = key.attributes;
  *(int3 *)&(this->successorKey).field_0x5 = key._5_3_;
  Memory::Recycler::WBSetBit((char *)&this->successorTypeWeakRef);
  (this->successorTypeWeakRef).ptr = typeWeakRef;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->successorTypeWeakRef);
  if (key.propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7e,"(key.HasInfo())","key.HasInfo()");
    if (!bVar2) goto LAB_00dcdc7f;
    *puVar3 = 0;
  }
  if (typeWeakRef == (RecyclerWeakReference<Js::DynamicType> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7f,"(typeWeakRef != nullptr)","typeWeakRef != nullptr");
    if (!bVar2) {
LAB_00dcdc7f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_PathTypeSuccessorInfo).kind = PathTypeSuccessorKindSingle;
  return;
}

Assistant:

PathTypeSingleSuccessorInfo::PathTypeSingleSuccessorInfo(const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef)
        : successorKey(key), successorTypeWeakRef(typeWeakRef)
    {
        Assert(key.HasInfo());
        Assert(typeWeakRef != nullptr);
        this->kind = PathTypeSuccessorKindSingle;
    }